

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash.c
# Opt level: O2

int start_hash(gost_hash_ctx *ctx)

{
  if (ctx->cipher_ctx != (gost_ctx *)0x0) {
    ctx->len = 0;
    ctx->left = 0;
    ctx->H[0] = '\0';
    ctx->H[1] = '\0';
    ctx->H[2] = '\0';
    ctx->H[3] = '\0';
    ctx->H[4] = '\0';
    ctx->H[5] = '\0';
    ctx->H[6] = '\0';
    ctx->H[7] = '\0';
    ctx->H[8] = '\0';
    ctx->H[9] = '\0';
    ctx->H[10] = '\0';
    ctx->H[0xb] = '\0';
    ctx->H[0xc] = '\0';
    ctx->H[0xd] = '\0';
    ctx->H[0xe] = '\0';
    ctx->H[0xf] = '\0';
    ctx->H[0x10] = '\0';
    ctx->H[0x11] = '\0';
    ctx->H[0x12] = '\0';
    ctx->H[0x13] = '\0';
    ctx->H[0x14] = '\0';
    ctx->H[0x15] = '\0';
    ctx->H[0x16] = '\0';
    ctx->H[0x17] = '\0';
    ctx->H[0x18] = '\0';
    ctx->H[0x19] = '\0';
    ctx->H[0x1a] = '\0';
    ctx->H[0x1b] = '\0';
    *(undefined8 *)(ctx->H + 0x1c) = 0;
    ctx->S[4] = '\0';
    ctx->S[5] = '\0';
    ctx->S[6] = '\0';
    ctx->S[7] = '\0';
    ctx->S[8] = '\0';
    ctx->S[9] = '\0';
    ctx->S[10] = '\0';
    ctx->S[0xb] = '\0';
    ctx->S[0xc] = '\0';
    ctx->S[0xd] = '\0';
    ctx->S[0xe] = '\0';
    ctx->S[0xf] = '\0';
    ctx->S[0x10] = '\0';
    ctx->S[0x11] = '\0';
    ctx->S[0x12] = '\0';
    ctx->S[0x13] = '\0';
    ctx->S[0x14] = '\0';
    ctx->S[0x15] = '\0';
    ctx->S[0x16] = '\0';
    ctx->S[0x17] = '\0';
    ctx->S[0x18] = '\0';
    ctx->S[0x19] = '\0';
    ctx->S[0x1a] = '\0';
    ctx->S[0x1b] = '\0';
    ctx->S[0x1c] = '\0';
    ctx->S[0x1d] = '\0';
    ctx->S[0x1e] = '\0';
    ctx->S[0x1f] = '\0';
    return 1;
  }
  return 0;
}

Assistant:

int start_hash(gost_hash_ctx * ctx)
{
    if (!ctx->cipher_ctx)
        return 0;
    memset(&(ctx->H), 0, 32);
    memset(&(ctx->S), 0, 32);
    ctx->len = 0L;
    ctx->left = 0;
    return 1;
}